

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O1

string * __thiscall
cpptrace::microfmt::detail::to_string_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,uint64_t value,format_options *options)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  detail *pdVar4;
  char *value_00;
  uint uVar5;
  
  bVar1 = *(byte *)(value + 0x10);
  if (bVar1 < 0x68) {
    if (bVar1 == 0x48) {
      value_00 = "0123456789ABCDEF";
LAB_00134852:
      to_string<4,15>(__return_storage_ptr__,this,(uint64_t)value_00,(char *)options);
      return __return_storage_ptr__;
    }
    if (bVar1 == 0x62) {
      to_string<1,1>(__return_storage_ptr__,this,0x192a47,(char *)options);
      return __return_storage_ptr__;
    }
  }
  else {
    if (bVar1 == 0x68) {
      value_00 = "0123456789abcdef";
      goto LAB_00134852;
    }
    if (bVar1 == 0x6f) {
      to_string<3,7>(__return_storage_ptr__,this,0x192a47,(char *)options);
      return __return_storage_ptr__;
    }
  }
  uVar5 = 1;
  if ((detail *)&DAT_00000009 < this) {
    pdVar4 = this;
    uVar3 = 4;
    do {
      uVar5 = uVar3;
      if (pdVar4 < (detail *)0x64) {
        uVar5 = uVar5 - 2;
        goto LAB_00134866;
      }
      if (pdVar4 < (detail *)0x3e8) {
        uVar5 = uVar5 - 1;
        goto LAB_00134866;
      }
      if (pdVar4 < (detail *)0x2710) goto LAB_00134866;
      bVar2 = (detail *)0x1869f < pdVar4;
      pdVar4 = (detail *)((ulong)pdVar4 / 10000);
      uVar3 = uVar5 + 4;
    } while (bVar2);
    uVar5 = uVar5 + 1;
  }
LAB_00134866:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (__return_storage_ptr__,(ulong)uVar5,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,(unsigned_long)this);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(std::uint64_t value, const format_options& options) {
            switch(options.base) {
                case 'H': return to_string<4, 0xf>(value, "0123456789ABCDEF");
                case 'h': return to_string<4, 0xf>(value);
                case 'o': return to_string<3, 0x7>(value);
                case 'b': return to_string<1, 0x1>(value);
                default: return std::to_string(value); // failure: decimal
            }
        }